

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDeferredTestReporter.cpp
# Opt level: O0

void __thiscall
UnitTest::anon_unknown_0::
TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage::RunImpl
          (TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_c8 [8];
  DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper fixtureHelper;
  bool ctorOk;
  TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper::
  DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper
            ((DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper *)
             local_c8,&(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper>
            ((DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper *)
             local_c8,&(this->super_Test).m_details);
  DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper::
  ~DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper
            ((DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper *)
             local_c8);
  return;
}

Assistant:

TEST_FIXTURE(DeferredTestReporterFixture, DeferredTestReporterTakesCopyOfFailureMessage)
{
    reporter.ReportTestStart(details);

    char failureMessage[128];
    char const* goodStr = "Real failure message";
    char const* badStr = "Bogus failure message";
    
	using namespace std;

    strcpy(failureMessage, goodStr);
    reporter.ReportFailure(details, failureMessage);
    strcpy(failureMessage, badStr);

    DeferredTestResult const& result = reporter.GetResults().at(0);
    DeferredTestResult::Failure const& failure = result.failures.at(0);
    CHECK_EQUAL(goodStr, failure.second);
}